

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O2

void __thiscall MyServerConnection::OnConnect(MyServerConnection *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  TonkStatusEx status;
  TonkStatusEx TStack_218;
  LogStringBuffer local_198;
  
  tonk::SDKConnection::GetStatusEx(&TStack_218,&this->super_SDKConnection);
  if ((int)Logger.ChannelMinLevel < 3) {
    this_00 = &local_198.LogStream;
    local_198.ChannelName = Logger.ChannelName;
    local_198.LogLevel = Info;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&Logger.Prefix);
    std::operator<<((ostream *)this_00,"Client connected from ");
    std::operator<<((ostream *)this_00,TStack_218.Remote.NetworkString);
    std::operator<<((ostream *)this_00," : ");
    std::ostream::operator<<((ostream *)this_00,TStack_218.Remote.UDPPort);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return;
}

Assistant:

void MyServerConnection::OnConnect()
{
    auto status = GetStatusEx();

    Logger.Info("Client connected from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort);
}